

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

BOOL PAL_LOADUnloadPEFile(void *ptr)

{
  BOOL local_14;
  BOOL retval;
  void *ptr_local;
  
  local_14 = 0;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (ptr == (void *)0x0) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
  }
  else {
    local_14 = MAPUnmapPEFile(ptr);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return local_14;
  }
  abort();
}

Assistant:

BOOL
PALAPI
PAL_LOADUnloadPEFile(void * ptr)
{
    BOOL retval = FALSE;

    ENTRY("PAL_LOADUnloadPEFile (ptr=%p)\n", ptr);

    if (nullptr == ptr)
    {
        ERROR( "Invalid pointer value\n" );
    }
    else
    {
        retval = MAPUnmapPEFile(ptr);
    }

    LOGEXIT("PAL_LOADUnloadPEFile returns %d\n", retval);
    return retval;
}